

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclConfig.cpp
# Opt level: O0

void __thiscall xmrig::OclConfig::generate(OclConfig *this)

{
  bool bVar1;
  uint uVar2;
  String *this_00;
  EVP_PKEY_CTX *ctx;
  size_t sVar3;
  OclConfig *in_RDI;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *unaff_retaddr;
  vector<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_> *in_stack_00000008;
  OclConfig *in_stack_00000010;
  OclPlatform *in_stack_00000018;
  size_t count;
  vector<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_> devices;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa7;
  byte bVar4;
  OclPlatform in_stack_ffffffffffffffa8;
  
  bVar1 = isEnabled(in_RDI);
  if ((bVar1) &&
     (bVar1 = Threads<xmrig::OclThreads>::has
                        ((Threads<xmrig::OclThreads> *)
                         CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0)), !bVar1)) {
    this_00 = loader(in_RDI);
    ctx = (EVP_PKEY_CTX *)String::operator_cast_to_char_(this_00);
    uVar2 = OclLib::init(ctx);
    if ((uVar2 & 1) != 0) {
      bVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::empty
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_RDI);
      bVar4 = 0;
      if (bVar1) {
        platform(in_stack_00000010);
        OclPlatform::devices(in_stack_00000018);
      }
      else {
        in_stack_ffffffffffffffa8 = platform(in_stack_00000010);
        OclPlatform::devices(in_stack_00000018);
        bVar4 = 1;
        filterDevices(in_stack_00000008,unaff_retaddr);
      }
      if ((bVar4 & 1) != 0) {
        std::vector<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_>::~vector
                  ((vector<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_> *)in_RDI);
      }
      bVar1 = std::vector<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_>::empty
                        ((vector<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_> *)in_RDI);
      if (!bVar1) {
        sVar3 = xmrig::generate((Threads<xmrig::OclThreads> *)in_stack_ffffffffffffffa8.m_index,
                                (vector<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_> *)
                                in_stack_ffffffffffffffa8.m_id);
        in_RDI->m_shouldSave = sVar3 != 0;
      }
      std::vector<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_>::~vector
                ((vector<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_> *)in_RDI);
    }
  }
  return;
}

Assistant:

void xmrig::OclConfig::generate()
{
    if (!isEnabled() || m_threads.has()) {
        return;
    }

    if (!OclLib::init(loader())) {
        return;
    }

    const auto devices = m_devicesHint.empty() ? platform().devices() : filterDevices(platform().devices(), m_devicesHint);
    if (devices.empty()) {
        return;
    }

    size_t count = 0;

    count += xmrig::generate(m_threads, devices);

    m_shouldSave = count > 0;
}